

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_realm_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  char *name;
  magic_realm *realm;
  magic_realm *h;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  pcVar2 = parser_getstr(p,"name");
  *v = pvVar1;
  parser_setpriv(p,v);
  pcVar2 = string_make(pcVar2);
  v[2] = pcVar2;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_realm_name(struct parser *p) {
	struct magic_realm *h = parser_priv(p);
	struct magic_realm *realm = mem_zalloc(sizeof *realm);
	const char *name = parser_getstr(p, "name");

	realm->next = h;
	parser_setpriv(p, realm);
	realm->name = string_make(name);
	return PARSE_ERROR_NONE;
}